

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLStringTokenizer.cpp
# Opt level: O2

XMLCh * __thiscall xercesc_4_0::XMLStringTokenizer::nextToken(XMLStringTokenizer *this)

{
  ulong endIndex;
  ulong uVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  undefined4 extraout_var;
  long lVar6;
  long lVar7;
  XMLSize_t local_40;
  XMLCh *targetStr;
  
  uVar1 = this->fOffset;
  uVar5 = this->fStringLen;
  if (uVar1 < uVar5) {
    lVar6 = 2;
    bVar2 = false;
    local_40 = uVar1;
    for (lVar7 = 0; endIndex = lVar7 + uVar1, endIndex < uVar5; lVar7 = lVar7 + 1) {
      bVar3 = isDelimeter(this,this->fString[uVar1 + lVar7]);
      if (bVar3) {
        if (bVar2) {
          this->fOffset = endIndex;
          goto LAB_0026808c;
        }
        local_40 = local_40 + 1;
      }
      else {
        bVar2 = true;
      }
      uVar5 = this->fStringLen;
      lVar6 = lVar6 + 2;
    }
    this->fOffset = endIndex;
    if (bVar2) {
LAB_0026808c:
      iVar4 = (*this->fMemoryManager->_vptr_MemoryManager[3])
                        (this->fMemoryManager,uVar1 * 2 + local_40 * -2 + lVar6);
      targetStr = (XMLCh *)CONCAT44(extraout_var,iVar4);
      XMLString::subString(targetStr,this->fString,local_40,endIndex,this->fMemoryManager);
      BaseRefVectorOf<char16_t>::addElement
                (&this->fTokens->super_BaseRefVectorOf<char16_t>,targetStr);
      return targetStr;
    }
  }
  return (XMLCh *)0x0;
}

Assistant:

XMLCh* XMLStringTokenizer::nextToken() {

    if (fOffset >= fStringLen) {
        return 0;
    }

    bool tokFound = false;
    XMLSize_t startIndex = fOffset;
    XMLSize_t endIndex = fOffset;

    for (; endIndex < fStringLen; endIndex++) {

        if (isDelimeter(fString[endIndex])) {

			if (tokFound) {
                break;
            }

			startIndex++;
			continue;
        }

        tokFound = true;
    }

    fOffset = endIndex;

    if (tokFound) {

        XMLCh* tokStr = (XMLCh*) fMemoryManager->allocate
        (
            (endIndex - startIndex + 1) * sizeof(XMLCh)
        );//new XMLCh[(endIndex - startIndex) + 1];

        XMLString::subString(tokStr, fString, startIndex, endIndex, fMemoryManager);
        fTokens->addElement(tokStr);

        return tokStr;
	}

    return 0;
}